

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

size_t QHashPrivate::GrowthPolicy::bucketsForCapacity(size_t requestedCapacity)

{
  uint uVar1;
  ulong in_RDI;
  int count;
  int SizeDigits;
  undefined8 local_8;
  
  if (in_RDI < 0x41) {
    local_8 = 0x80;
  }
  else {
    uVar1 = qCountLeadingZeroBits(0x15a592);
    if ((int)uVar1 < 2) {
      local_8 = std::numeric_limits<unsigned_long>::max();
    }
    else {
      local_8 = 1L << (0x41U - (char)uVar1 & 0x3f);
    }
  }
  return local_8;
}

Assistant:

inline constexpr size_t bucketsForCapacity(size_t requestedCapacity) noexcept
{
    constexpr int SizeDigits = std::numeric_limits<size_t>::digits;

    // We want to use at minimum a full span (128 entries), so we hardcode it for any requested
    // capacity <= 64. Any capacity above that gets rounded to a later power of two.
    if (requestedCapacity <= 64)
        return SpanConstants::NEntries;

    // Same as
    //    qNextPowerOfTwo(2 * requestedCapacity);
    //
    // but ensuring neither our multiplication nor the function overflow.
    // Additionally, the maximum memory allocation is 2^31-1 or 2^63-1 bytes
    // (limited by qsizetype and ptrdiff_t).
    int count = qCountLeadingZeroBits(requestedCapacity);
    if (count < 2)
        return (std::numeric_limits<size_t>::max)();    // will cause std::bad_alloc
    return size_t(1) << (SizeDigits - count + 1);
}